

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void ImGui::ShadeVertsLinearColorGradientKeepAlpha
               (ImDrawVert *vert_start,ImDrawVert *vert_end,ImVec2 gradient_p0,ImVec2 gradient_p1,
               ImU32 col0,ImU32 col1)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar3 = gradient_p1.x - gradient_p0.x;
  fVar4 = gradient_p1.y - gradient_p0.y;
  uVar2 = col0 >> 8 & 0xff;
  uVar1 = col0 >> 0x10 & 0xff;
  for (; vert_start < vert_end; vert_start = vert_start + 1) {
    fVar5 = (((vert_start->pos).x - gradient_p0.x) * fVar3 +
            ((vert_start->pos).y - gradient_p0.y) * fVar4) * (1.0 / (fVar3 * fVar3 + fVar4 * fVar4))
    ;
    fVar6 = 1.0;
    if (fVar5 <= 1.0) {
      fVar6 = fVar5;
    }
    fVar6 = (float)(~-(uint)(fVar5 < 0.0) & (uint)fVar6);
    vert_start->col =
         (uint)*(byte *)((long)&vert_start->col + 3) << 0x18 |
         (int)((float)(int)((col1 & 0xff) - (col0 & 0xff)) * fVar6 + (float)(col0 & 0xff)) |
         (int)((float)(int)((col1 >> 8 & 0xff) - uVar2) * fVar6 + (float)uVar2) << 8 |
         (int)(fVar6 * (float)(int)((col1 >> 0x10 & 0xff) - uVar1) + (float)uVar1) << 0x10;
  }
  return;
}

Assistant:

static inline ImVec2 operator-(const ImVec2& lhs, const ImVec2& rhs)            { return ImVec2(lhs.x-rhs.x, lhs.y-rhs.y); }